

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O2

void __thiscall TextReader::parse_error(TextReader *this,string *message)

{
  size_t pos;
  size_t line_index;
  TextReaderException *this_00;
  string sStack_a8;
  string local_88;
  TextReaderException exception;
  
  pos = this->current_token_pos_;
  line_index = this->current_line_index_;
  std::__cxx11::string::string((string *)&local_88,(string *)&this->current_line_);
  std::__cxx11::string::string((string *)&sStack_a8,(string *)message);
  TextReaderException::TextReaderException(&exception,line_index,pos,&local_88,&sStack_a8);
  std::__cxx11::string::~string((string *)&sStack_a8);
  std::__cxx11::string::~string((string *)&local_88);
  this_00 = (TextReaderException *)__cxa_allocate_exception(0x50);
  TextReaderException::TextReaderException(this_00,&exception);
  __cxa_throw(this_00,&TextReaderException::typeinfo,TextReaderException::~TextReaderException);
}

Assistant:

void parse_error(std::string message) {
        TextReaderException exception(current_line_index_, current_token_pos_, current_line_, message);
        throw exception;
    }